

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_add_checked(void **param_1)

{
  roaring64_bitmap_t *b;
  char *in_RDI;
  unsigned_long unaff_retaddr;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000080;
  int in_stack_ffffffffffffffec;
  
  b = roaring64_bitmap_create();
  roaring64_bitmap_add_checked((roaring64_bitmap_t *)param_1,(uint64_t)r);
  _assert_true(unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_add_checked((roaring64_bitmap_t *)param_1,(uint64_t)r);
  _assert_true(unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_add_checked((roaring64_bitmap_t *)param_1,(uint64_t)r);
  _assert_true(unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_add_checked((roaring64_bitmap_t *)param_1,(uint64_t)r);
  _assert_true(unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_add_checked((roaring64_bitmap_t *)param_1,(uint64_t)r);
  _assert_true(unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_add_checked((roaring64_bitmap_t *)param_1,(uint64_t)r);
  _assert_true(unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r,unaff_retaddr);
  _assert_true(unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r,unaff_retaddr);
  _assert_true(unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r,unaff_retaddr);
  _assert_true(unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_free(in_stack_00000080);
  return;
}

Assistant:

DEFINE_TEST(test_add_checked) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    assert_true(roaring64_bitmap_add_checked(r, 0));
    assert_false(roaring64_bitmap_add_checked(r, 0));
    assert_true(roaring64_bitmap_add_checked(r, 10000));
    assert_false(roaring64_bitmap_add_checked(r, 10000));
    assert_true(roaring64_bitmap_add_checked(r, 200000));
    assert_false(roaring64_bitmap_add_checked(r, 200000));

    assert_r64_valid(r);
    assert_true(roaring64_bitmap_contains(r, 0));
    assert_true(roaring64_bitmap_contains(r, 10000));
    assert_true(roaring64_bitmap_contains(r, 200000));

    roaring64_bitmap_free(r);
}